

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_evalfile(t_symbol *name,t_symbol *dir)

{
  _class **pp_Var1;
  _class **pp_Var2;
  int iVar3;
  int iVar4;
  _binbuf *b;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  t_symbol *ptVar8;
  _binbuf *p_Var9;
  char *pcVar10;
  bool bVar11;
  
  b = binbuf_new();
  pcVar10 = name->s_name;
  sVar5 = strlen(pcVar10);
  pcVar10 = pcVar10 + (sVar5 - 4);
  iVar3 = strcmp(pcVar10,".pat");
  if (iVar3 == 0) {
    bVar11 = true;
  }
  else {
    iVar3 = strcmp(pcVar10,".mxt");
    bVar11 = iVar3 == 0;
  }
  iVar3 = canvas_suspend_dsp();
  glob_setfilename((void *)0x0,name,dir);
  iVar4 = binbuf_read(b,name->s_name,dir->s_name,0);
  p_Var9 = b;
  if (iVar4 == 0) {
    ptVar8 = gensym("#A");
    pp_Var2 = s__N.s_thing;
    pp_Var1 = ptVar8->s_thing;
    ptVar8 = gensym("#A");
    ptVar8->s_thing = (_class **)0x0;
    s__N.s_thing = &pd_canvasmaker;
    if (bVar11) {
      p_Var9 = binbuf_convert(b,1);
      binbuf_free(b);
    }
    binbuf_eval(p_Var9,(t_pd *)0x0,0,(t_atom *)0x0);
    if ((s__X.s_thing != (_class **)0x0) && (*s__X.s_thing == canvas_class)) {
      canvas_initbang((_glist *)s__X.s_thing);
    }
    ptVar8 = gensym("#A");
    ptVar8->s_thing = pp_Var1;
    s__N.s_thing = pp_Var2;
  }
  else {
    pcVar10 = name->s_name;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    pd_error((void *)0x0,"%s: read failed; %s",pcVar10,pcVar7);
  }
  glob_setfilename((void *)0x0,&s_,&s_);
  binbuf_free(p_Var9);
  canvas_resume_dsp(iVar3);
  return;
}

Assistant:

void binbuf_evalfile(t_symbol *name, t_symbol *dir)
{
    t_binbuf *b = binbuf_new();
    int import = !strcmp(name->s_name + strlen(name->s_name) - 4, ".pat") ||
        !strcmp(name->s_name + strlen(name->s_name) - 4, ".mxt");
    int dspstate = canvas_suspend_dsp();
        /* set filename so that new canvases can pick them up */
    glob_setfilename(0, name, dir);
    if (binbuf_read(b, name->s_name, dir->s_name, 0))
        pd_error(0, "%s: read failed; %s", name->s_name, strerror(errno));
    else
    {
            /* save bindings of symbols #N, #A (and restore afterward) */
        t_pd *bounda = gensym("#A")->s_thing, *boundn = s__N.s_thing;
        gensym("#A")->s_thing = 0;
        s__N.s_thing = &pd_canvasmaker;
        if (import)
        {
            t_binbuf *newb = binbuf_convert(b, 1);
            binbuf_free(b);
            b = newb;
        }
        binbuf_eval(b, 0, 0, 0);
            /* avoid crashing if no canvas was created by binbuf eval */
        if (s__X.s_thing && *s__X.s_thing == canvas_class)
            canvas_initbang((t_canvas *)(s__X.s_thing)); /* JMZ*/
        gensym("#A")->s_thing = bounda;
        s__N.s_thing = boundn;
    }
    glob_setfilename(0, &s_, &s_);
    binbuf_free(b);
    canvas_resume_dsp(dspstate);
}